

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heterogeneous_queue_basic_tests.cpp
# Opt level: O3

void density_tests::
     dynamic_push_3<density_tests::Derived1,density::heter_queue<density::runtime_type<density::f_default_construct,density::f_move_construct,density::f_copy_construct,density::f_destroy,density::f_size,density::f_alignment>,density::basic_default_allocator<65536ul>>>
               (heter_queue<density::runtime_type<density::f_default_construct,_density::f_move_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>_>
                *i_queue)

{
  runtime_type<density::f_default_construct,_density::f_move_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>
  type;
  Derived1 move_source;
  Derived1 copy_source;
  runtime_type<density::f_default_construct,_density::f_move_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>
  local_c0;
  undefined1 local_b8 [24];
  undefined1 local_a0 [16];
  double local_90;
  InstanceCounted local_88 [16];
  undefined1 local_78 [24];
  undefined1 local_60 [16];
  double local_50;
  InstanceCounted local_48 [24];
  
  local_c0.m_feature_table =
       (tuple_type *)
       density::detail::
       FeatureTable<std::tuple<density::f_default_construct,density::f_move_construct,density::f_copy_construct,density::f_destroy,density::f_size,density::f_alignment>,density_tests::Derived1>
       ::s_table;
  density::
  heter_queue<density::runtime_type<density::f_default_construct,_density::f_move_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>_>
  ::dyn_push(i_queue,&local_c0);
  local_60._8_4_ = 0x23;
  InstanceCounted::new_instance((InstanceCounted *)(local_60 + 0xc));
  local_60._0_8_ = &PTR_class_id_01067338;
  local_50 = 22.0;
  InstanceCounted::new_instance(local_48);
  local_78._0_8_ = Derived1::vtable + 0x18;
  local_60._0_8_ = Derived1::vtable + 0x50;
  local_78._8_8_ = 999;
  InstanceCounted::new_instance((InstanceCounted *)(local_78 + 0x10));
  density::
  heter_queue<density::runtime_type<density::f_default_construct,_density::f_move_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>_>
  ::dyn_push_copy(i_queue,&local_c0,local_78);
  local_a0._8_4_ = 0x23;
  InstanceCounted::new_instance((InstanceCounted *)(local_a0 + 0xc));
  local_a0._0_8_ = &PTR_class_id_01067338;
  local_90 = 22.0;
  InstanceCounted::new_instance(local_88);
  local_b8._0_8_ = Derived1::vtable + 0x18;
  local_a0._0_8_ = Derived1::vtable + 0x50;
  local_b8._8_8_ = 999;
  InstanceCounted::new_instance((InstanceCounted *)(local_b8 + 0x10));
  density::
  heter_queue<density::runtime_type<density::f_default_construct,_density::f_move_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>_>
  ::dyn_push_move(i_queue,&local_c0,local_b8);
  Derived1::~Derived1((Derived1 *)local_b8,&Derived1::VTT);
  PolymorphicBase::~PolymorphicBase((PolymorphicBase *)local_a0);
  Derived1::~Derived1((Derived1 *)local_78,&Derived1::VTT);
  PolymorphicBase::~PolymorphicBase((PolymorphicBase *)local_60);
  return;
}

Assistant:

void dynamic_push_3(QUEUE & i_queue)
    {
        auto const type = QUEUE::runtime_type::template make<ELEMENT>();

        i_queue.dyn_push(type);

        ELEMENT copy_source;
        i_queue.dyn_push_copy(type, &copy_source);

        ELEMENT move_source;
        i_queue.dyn_push_move(type, &move_source);
    }